

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

void __thiscall QPDF::decryptString(QPDF *this,string *str,QPDFObjGen og)

{
  long lVar1;
  size_t len;
  uint uVar2;
  uchar *puVar3;
  RC4_KEY *key_00;
  QPDFObjGen og_00;
  byte bVar4;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var5;
  uchar *in_R8;
  QPDFObjGen og_local;
  unique_ptr<char[],_std::default_delete<char[]>_> tmp;
  Pl_Buffer bufpl;
  string key;
  __shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2> local_100;
  Pl_AES_PDF pl;
  
  if (og.obj == 0) {
    return;
  }
  _Var5._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  lVar1 = *(long *)&((_Var5._M_head_impl)->encp).
                    super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>;
  if (*(int *)(lVar1 + 4) < 4) {
switchD_001cca57_caseD_2:
    bVar4 = 0;
  }
  else {
    switch(*(undefined4 *)(lVar1 + 0x44)) {
    case 0:
      goto switchD_001cca57_caseD_0;
    default:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bufpl,
                 "unknown encryption filter for strings (check /StrF in /Encrypt dictionary); strings may be decrypted improperly"
                 ,(allocator<char> *)&key);
      damagedPDF((QPDFExc *)&pl,this,(string *)&bufpl);
      warn(this,(QPDFExc *)&pl);
      QPDFExc::~QPDFExc((QPDFExc *)&pl);
      std::__cxx11::string::~string((string *)&bufpl);
      _Var5._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      *(undefined4 *)
       ((long)((_Var5._M_head_impl)->encp).
              super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
       0x44) = 3;
    case 3:
    case 4:
      bVar4 = 1;
      break;
    case 2:
      goto switchD_001cca57_caseD_2;
    }
  }
  std::__shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_100,
             &((_Var5._M_head_impl)->encp).
              super___shared_ptr<QPDF::EncryptionParameters,_(__gnu_cxx::_Lock_policy)2>);
  og_00._1_7_ = 0;
  og_00.obj._0_1_ = bVar4;
  getKeyForObject_abi_cxx11_
            (&key,(QPDF *)&local_100,(shared_ptr<QPDF::EncryptionParameters> *)og,og_00,
             SUB81(in_R8,0));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100._M_refcount);
  if (bVar4 == 0) {
    len = str->_M_string_length;
    QUtil::make_unique_cstr((QUtil *)&tmp,str);
    key_00 = (RC4_KEY *)QUtil::unsigned_char_pointer(&key);
    pl.super_Pipeline._vptr_Pipeline = (_func_int **)key._M_string_length;
    uVar2 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert((unsigned_long *)&pl);
    RC4::RC4((RC4 *)&bufpl,key_00,(ulong)uVar2,(uchar *)og_00,in_R8);
    puVar3 = QUtil::unsigned_char_pointer
                       ((char *)tmp._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                                _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                super__Head_base<0UL,_char_*,_false>._M_head_impl);
    RC4::process((RC4 *)&bufpl,puVar3,len,puVar3);
    pl.super_Pipeline._vptr_Pipeline = (_func_int **)&pl.super_Pipeline.identifier._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&pl,
               tmp._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
               super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl,
               len + (long)tmp._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl);
    std::__cxx11::string::operator=((string *)str,(string *)&pl);
    std::__cxx11::string::~string((string *)&pl);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bufpl.super_Pipeline.identifier);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&tmp);
  }
  else {
    Pl_Buffer::Pl_Buffer(&bufpl,"decrypted string",(Pipeline *)0x0);
    puVar3 = QUtil::unsigned_char_pointer(&key);
    Pl_AES_PDF::Pl_AES_PDF
              (&pl,"aes decrypt string",&bufpl.super_Pipeline,false,puVar3,key._M_string_length);
    Pipeline::writeString(&pl.super_Pipeline,str);
    Pl_AES_PDF::finish(&pl);
    Pl_Buffer::getString_abi_cxx11_((string *)&tmp,&bufpl);
    std::__cxx11::string::operator=((string *)str,(string *)&tmp);
    std::__cxx11::string::~string((string *)&tmp);
    Pl_AES_PDF::~Pl_AES_PDF(&pl);
    Pl_Buffer::~Pl_Buffer(&bufpl);
  }
  std::__cxx11::string::~string((string *)&key);
switchD_001cca57_caseD_0:
  return;
}

Assistant:

void
QPDF::decryptString(std::string& str, QPDFObjGen og)
{
    if (!og.isIndirect()) {
        return;
    }
    bool use_aes = false;
    if (m->encp->encryption_V >= 4) {
        switch (m->encp->cf_string) {
        case e_none:
            return;

        case e_aes:
            use_aes = true;
            break;

        case e_aesv3:
            use_aes = true;
            break;

        case e_rc4:
            break;

        default:
            warn(damagedPDF(
                "unknown encryption filter for strings (check /StrF in "
                "/Encrypt dictionary); strings may be decrypted improperly"));
            // To avoid repeated warnings, reset cf_string.  Assume we'd want to use AES if V == 4.
            m->encp->cf_string = e_aes;
            use_aes = true;
            break;
        }
    }

    std::string key = getKeyForObject(m->encp, og, use_aes);
    try {
        if (use_aes) {
            QTC::TC("qpdf", "QPDF_encryption aes decode string");
            Pl_Buffer bufpl("decrypted string");
            Pl_AES_PDF pl(
                "aes decrypt string",
                &bufpl,
                false,
                QUtil::unsigned_char_pointer(key),
                key.length());
            pl.writeString(str);
            pl.finish();
            str = bufpl.getString();
        } else {
            QTC::TC("qpdf", "QPDF_encryption rc4 decode string");
            size_t vlen = str.length();
            // Using std::shared_ptr guarantees that tmp will be freed even if rc4.process throws an
            // exception.
            auto tmp = QUtil::make_unique_cstr(str);
            RC4 rc4(QUtil::unsigned_char_pointer(key), toI(key.length()));
            auto data = QUtil::unsigned_char_pointer(tmp.get());
            rc4.process(data, vlen, data);
            str = std::string(tmp.get(), vlen);
        }
    } catch (QPDFExc&) {
        throw;
    } catch (std::runtime_error& e) {
        throw damagedPDF("error decrypting string for object " + og.unparse() + ": " + e.what());
    }
}